

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3ReadNextPos(char **pp,sqlite3_int64 *pi)

{
  long *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int iVal;
  int local_24;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)*(char *)*in_RDI & 0xfeU) == 0) {
    *in_RSI = 0x7fffffffffffffff;
  }
  else {
    local_c = 0xaaaaaaaa;
    if ((*(byte *)*in_RDI & 0x80) == 0) {
      local_c = (uint)*(byte *)*in_RDI;
      local_24 = 1;
    }
    else {
      local_24 = sqlite3Fts3GetVarint32((char *)*in_RDI,(int *)&local_c);
    }
    *in_RDI = *in_RDI + (long)local_24;
    *in_RSI = (long)(int)local_c + *in_RSI;
    *in_RSI = *in_RSI + -2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3ReadNextPos(
  char **pp,                    /* IN/OUT: Pointer into position-list buffer */
  sqlite3_int64 *pi             /* IN/OUT: Value read from position-list */
){
  if( (**pp)&0xFE ){
    int iVal;
    *pp += fts3GetVarint32((*pp), &iVal);
    *pi += iVal;
    *pi -= 2;
  }else{
    *pi = POSITION_LIST_END;
  }
}